

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O0

void __thiscall Assimp::MD3Importer::ValidateHeaderOffsets(MD3Importer *this)

{
  DeadlyImportError *pDVar1;
  Logger *this_00;
  allocator<char> local_109;
  string local_108;
  undefined1 local_e2;
  allocator<char> local_e1;
  string local_e0;
  undefined1 local_ba;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_92;
  allocator<char> local_91;
  string local_90;
  undefined1 local_6a;
  allocator<char> local_69;
  string local_68;
  undefined1 local_45;
  allocator<char> local_31;
  string local_30;
  MD3Importer *local_10;
  MD3Importer *this_local;
  
  local_10 = this;
  if ((this->pcHeader->IDENT != 0x49445033) && (this->pcHeader->IDENT != 0x33504449)) {
    local_45 = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Invalid MD3 file: Magic bytes not found",&local_31);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_30);
    local_45 = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (0xf < this->pcHeader->VERSION) {
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,"Unsupported MD3 file version. Continuing happily ...");
  }
  if (this->pcHeader->NUM_SURFACES == 0) {
    local_6a = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Invalid md3 file: NUM_SURFACES is 0",&local_69);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_68);
    local_6a = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (((this->fileSize <= this->pcHeader->OFS_FRAMES) ||
      (this->fileSize <= this->pcHeader->OFS_SURFACES)) ||
     (this->fileSize < this->pcHeader->OFS_EOF)) {
    local_92 = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Invalid MD3 header: some offsets are outside the file",&local_91
              );
    DeadlyImportError::DeadlyImportError(pDVar1,&local_90);
    local_92 = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (0x25ed09 < this->pcHeader->NUM_SURFACES) {
    local_ba = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Invalid MD3 header: too many surfaces, would overflow",&local_b9
              );
    DeadlyImportError::DeadlyImportError(pDVar1,&local_b8);
    local_ba = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if ((ulong)this->fileSize <=
      (ulong)this->pcHeader->OFS_SURFACES + (ulong)this->pcHeader->NUM_SURFACES * 0x6c) {
    local_e2 = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Invalid MD3 header: some surfaces are outside the file",
               &local_e1);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_e0);
    local_e2 = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (this->pcHeader->NUM_FRAMES <= this->configFrameID) {
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"The requested frame is not existing the file",&local_109);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_108);
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  return;
}

Assistant:

void MD3Importer::ValidateHeaderOffsets()
{
    // Check magic number
    if (pcHeader->IDENT != AI_MD3_MAGIC_NUMBER_BE &&
        pcHeader->IDENT != AI_MD3_MAGIC_NUMBER_LE)
            throw DeadlyImportError( "Invalid MD3 file: Magic bytes not found");

    // Check file format version
    if (pcHeader->VERSION > 15)
        ASSIMP_LOG_WARN( "Unsupported MD3 file version. Continuing happily ...");

    // Check some offset values whether they are valid
    if (!pcHeader->NUM_SURFACES)
        throw DeadlyImportError( "Invalid md3 file: NUM_SURFACES is 0");

    if (pcHeader->OFS_FRAMES >= fileSize || pcHeader->OFS_SURFACES >= fileSize ||
        pcHeader->OFS_EOF > fileSize) {
        throw DeadlyImportError("Invalid MD3 header: some offsets are outside the file");
    }

	if (pcHeader->NUM_SURFACES > AI_MAX_ALLOC(MD3::Surface)) {
        throw DeadlyImportError("Invalid MD3 header: too many surfaces, would overflow");
	}

    if (pcHeader->OFS_SURFACES + pcHeader->NUM_SURFACES * sizeof(MD3::Surface) >= fileSize) {
        throw DeadlyImportError("Invalid MD3 header: some surfaces are outside the file");
    }

    if (pcHeader->NUM_FRAMES <= configFrameID )
        throw DeadlyImportError("The requested frame is not existing the file");
}